

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo5.cpp
# Opt level: O0

int64_t primesum::pi_lmo5(int64_t x)

{
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  int256_t *this;
  int256_t *other;
  int256_t *extraout_RDX;
  long in_RDI;
  int256_t sum;
  int256_t phi;
  int256_t s2;
  vector<int,_std::allocator<int>_> *in_stack_00000100;
  vector<int,_std::allocator<int>_> *in_stack_00000108;
  int256_t s1;
  vector<int,_std::allocator<int>_> primes;
  vector<int,_std::allocator<int>_> lpf;
  vector<int,_std::allocator<int>_> mu;
  int256_t p2;
  int64_t c;
  int64_t z;
  int64_t y;
  int64_t x13;
  double alpha;
  int64_t in_stack_fffffffffffffd68;
  int256_t *in_stack_fffffffffffffd78;
  long in_stack_fffffffffffffd80;
  int256_t *this_00;
  allocator<char> *c_00;
  allocator<char> *__a;
  char *in_stack_fffffffffffffda8;
  int256_t *piVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  int256_t *this_01;
  undefined8 in_stack_fffffffffffffdb8;
  int256_t *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  int64_t in_stack_fffffffffffffdd8;
  int64_t in_stack_fffffffffffffde8;
  int256_t local_1b8;
  long local_198;
  long local_190;
  long local_118;
  long local_110;
  long local_e8;
  long local_e0;
  int in_stack_ffffffffffffff34;
  int64_t in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff40 [16];
  allocator<char> local_a1;
  string local_a0 [12];
  int in_stack_ffffffffffffff6c;
  int64_t in_stack_ffffffffffffff70;
  int64_t in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff80 [16];
  allocator<char> local_69;
  string local_68 [32];
  int64_t local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_20;
  double local_18;
  long local_10;
  int64_t local_8;
  
  if (in_RDI < 2) {
    local_8 = 0;
  }
  else {
    local_20 = in_RDI >> 0x3f;
    x_02._8_8_ = in_stack_fffffffffffffdd8;
    x_02._0_8_ = in_stack_fffffffffffffdd0;
    local_10 = in_RDI;
    local_18 = get_alpha_lmo((int128_t)x_02);
    local_30 = iroot<3,long>(in_stack_fffffffffffffd80);
    local_38 = (long)((double)local_30 * local_18);
    local_40 = local_10 / local_38;
    local_48 = PhiTiny::get_c(in_stack_fffffffffffffd68);
    __a = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,__a);
    print((string *)0x145afd);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    c_00 = &local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,__a);
    print((string *)0x145b53);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
    this_00 = (int256_t *)&stack0xffffffffffffff37;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,__a);
    print((string *)0x145ba9);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
    local_e0 = local_10 >> 0x3f;
    local_e8 = local_10;
    x_00._8_8_ = in_stack_fffffffffffffdb8;
    x_00._0_8_ = in_stack_fffffffffffffdb0;
    print((int128_t)x_00,(int64_t)in_stack_fffffffffffffda8,(int64_t)__a,(int64_t)c_00,
          (double)this_00,1);
    local_110 = local_10 >> 0x3f;
    local_118 = local_10;
    P2((int128_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
    generate_moebius(in_stack_fffffffffffffdd8);
    generate_lpf(in_stack_fffffffffffffdd8);
    generate_primes((int64_t)in_stack_fffffffffffffda8);
    local_190 = local_10 >> 0x3f;
    local_198 = local_10;
    S1((int128_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
       in_stack_ffffffffffffff6c);
    this = (int256_t *)
           anon_unknown.dwarf_be0bd::S2
                     ((int64_t)s1.high,s1.low._8_8_,(int64_t)s1.low,in_stack_00000108,
                      in_stack_00000100,s2.high._8_8_);
    int256_t::int256_t<long,void>(&local_1b8,(long)this);
    int256_t::operator+(this,in_stack_fffffffffffffd78);
    other = (int256_t *)prime_sum_tiny(in_stack_fffffffffffffde8);
    x_01._8_8_ = other;
    x_01._0_8_ = extraout_RDX;
    piVar1 = other;
    this_01 = extraout_RDX;
    int256_t::operator+(in_stack_fffffffffffffdc8,(__int128)x_01);
    int256_t::operator-(this_01,(int)((ulong)piVar1 >> 0x20));
    int256_t::operator-(this,other);
    local_8 = int256_t::operator_cast_to_long(this_00);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  }
  return local_8;
}

Assistant:

int64_t pi_lmo5(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  print("");
  print("=== pi_lmo5(x) ===");
  print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
  print(x, y, z, c, alpha, 1);

  int256_t p2 = P2(x, y, 1);
  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}